

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

void __thiscall XmlRpc::XmlRpcValue::assertStruct(XmlRpcValue *this)

{
  tm *ptVar1;
  string *psVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type != TypeStruct) {
    if (this->_type != TypeInvalid) {
      psVar2 = (string *)__cxa_allocate_exception(0x28);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"type error: expected a struct","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_40 + local_38);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      __cxa_throw(psVar2,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
    }
    this->_type = TypeStruct;
    ptVar1 = (tm *)operator_new(0x30);
    ptVar1->tm_mon = 0;
    ptVar1->tm_year = 0;
    ptVar1->tm_wday = 0;
    ptVar1->tm_yday = 0;
    *(undefined8 *)&ptVar1->tm_isdst = 0;
    ptVar1->tm_gmtoff = 0;
    ptVar1->tm_sec = 0;
    ptVar1->tm_min = 0;
    ptVar1->tm_hour = 0;
    ptVar1->tm_mday = 0;
    *(int **)&ptVar1->tm_wday = &ptVar1->tm_hour;
    *(int **)&ptVar1->tm_isdst = &ptVar1->tm_hour;
    ptVar1->tm_gmtoff = 0;
    (this->_value).asTime = ptVar1;
  }
  return;
}

Assistant:

void XmlRpcValue::assertStruct()
  {
    if (_type == TypeInvalid) {
      _type = TypeStruct;
      _value.asStruct = new ValueStruct();
    } else if (_type != TypeStruct)
      throw XmlRpcException("type error: expected a struct");
  }